

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

int Strsafe_insert(char *data)

{
  s_x1node *psVar1;
  int iVar2;
  size_t __nmemb;
  s_x1 *psVar3;
  char cVar4;
  int iVar5;
  s_x1node *psVar6;
  long lVar7;
  char *pcVar8;
  s_x1node *psVar9;
  s_x1node *psVar10;
  uint uVar11;
  char **ppcVar12;
  s_x1node *psVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  
  psVar3 = x1a;
  if (x1a == (s_x1 *)0x0) {
    return 0;
  }
  cVar4 = *data;
  if (cVar4 == '\0') {
    uVar15 = 0;
  }
  else {
    pcVar8 = data + 1;
    uVar15 = 0;
    do {
      uVar15 = (int)cVar4 + uVar15 * 0xd;
      cVar4 = *pcVar8;
      pcVar8 = pcVar8 + 1;
    } while (cVar4 != '\0');
  }
  iVar2 = x1a->size;
  uVar16 = (ulong)(iVar2 - 1U & uVar15);
  psVar10 = (s_x1node *)x1a->ht;
  for (psVar6 = (s_x1node *)(&psVar10->data)[uVar16]; psVar6 != (s_x1node *)0x0;
      psVar6 = psVar6->next) {
    iVar5 = strcmp(psVar6->data,data);
    if (iVar5 == 0) {
      return 0;
    }
  }
  iVar5 = psVar3->count;
  if (iVar5 < iVar2) {
    psVar6 = psVar3->tbl;
  }
  else {
    __nmemb = (long)iVar2 * 2;
    psVar6 = (s_x1node *)calloc(__nmemb,0x20);
    if (psVar6 == (s_x1node *)0x0) {
      return 0;
    }
    psVar10 = psVar6 + (long)iVar2 * 2;
    iVar2 = (int)__nmemb;
    if (iVar5 < 1) {
      psVar9 = psVar3->tbl;
    }
    else {
      psVar9 = psVar3->tbl;
      lVar7 = 0;
      do {
        pcVar8 = psVar9[lVar7].data;
        cVar4 = *pcVar8;
        uVar11 = 0;
        if (cVar4 != '\0') {
          uVar11 = 0;
          pcVar14 = pcVar8;
          do {
            pcVar14 = pcVar14 + 1;
            uVar11 = (int)cVar4 + uVar11 * 0xd;
            cVar4 = *pcVar14;
          } while (cVar4 != '\0');
        }
        psVar1 = psVar6 + lVar7;
        ppcVar12 = &psVar10->data + (uVar11 & iVar2 - 1U);
        if ((s_x1node *)*ppcVar12 == (s_x1node *)0x0) {
          psVar13 = (s_x1node *)0x0;
        }
        else {
          ((s_x1node *)*ppcVar12)->from = &psVar1->next;
          psVar13 = (s_x1node *)*ppcVar12;
        }
        psVar1->next = psVar13;
        psVar1->data = pcVar8;
        psVar1->from = (s_x1node **)ppcVar12;
        *ppcVar12 = (char *)psVar1;
        lVar7 = lVar7 + 1;
      } while (lVar7 != iVar5);
    }
    free(psVar9);
    psVar3->size = iVar2;
    psVar3->tbl = psVar6;
    psVar3->ht = (s_x1node **)psVar10;
    uVar16 = (ulong)(iVar2 - 1U & uVar15);
  }
  psVar3->count = iVar5 + 1;
  psVar6 = psVar6 + iVar5;
  psVar6->data = data;
  if ((s_x1node *)(&psVar10->data)[uVar16] == (s_x1node *)0x0) {
    psVar9 = (s_x1node *)0x0;
  }
  else {
    ((s_x1node *)(&psVar10->data)[uVar16])->from = &psVar6->next;
    psVar9 = (s_x1node *)(&psVar10->data)[uVar16];
  }
  psVar6->next = psVar9;
  (&psVar10->data)[uVar16] = (char *)psVar6;
  psVar6->from = psVar3->ht + uVar16;
  return 1;
}

Assistant:

int Strsafe_insert(const char *data)
{
  x1node *np;
  unsigned h;
  unsigned ph;

  if( x1a==0 ) return 0;
  ph = strhash(data);
  h = ph & (x1a->size-1);
  np = x1a->ht[h];
  while( np ){
    if( strcmp(np->data,data)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x1a->count>=x1a->size ){
    /* Need to make the hash table bigger */
    int i,size;
    struct s_x1 array;
    array.size = size = x1a->size*2;
    array.count = x1a->count;
    array.tbl = (x1node*)calloc(size, sizeof(x1node) + sizeof(x1node*));
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x1node**)&(array.tbl[size]);
    for(i=0; i<size; i++) array.ht[i] = 0;
    for(i=0; i<x1a->count; i++){
      x1node *oldnp, *newnp;
      oldnp = &(x1a->tbl[i]);
      h = strhash(oldnp->data) & (size-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x1a->tbl);
    *x1a = array;
  }
  /* Insert the new data */
  h = ph & (x1a->size-1);
  np = &(x1a->tbl[x1a->count++]);
  np->data = data;
  if( x1a->ht[h] ) x1a->ht[h]->from = &(np->next);
  np->next = x1a->ht[h];
  x1a->ht[h] = np;
  np->from = &(x1a->ht[h]);
  return 1;
}